

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_guardedTests.cpp
# Opt level: O0

void __thiscall
MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
::deallocate(MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
             *this,zombie_list_node *memory,size_t size)

{
  event local_48 [2];
  allocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
  local_21;
  size_type local_20;
  size_t size_local;
  zombie_list_node *memory_local;
  MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
  *this_local;
  
  if (memory != (zombie_list_node *)0x0) {
    local_20 = size;
    size_local = (size_t)memory;
    memory_local = (zombie_list_node *)this;
    std::
    allocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
    ::allocator(&local_21);
    __gnu_cxx::
    new_allocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
    ::deallocate((new_allocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
                  *)&local_21,(zombie_list_node *)size_local,local_20);
    std::
    allocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
    ::~allocator(&local_21);
    local_48[0].size = local_20 * 0x18;
    local_48[0].allocated = false;
    std::vector<event,_std::allocator<event>_>::emplace_back<event>(this->log,local_48);
  }
  return;
}

Assistant:

void deallocate(T* memory, size_t size)
    {
        if (memory) {
            std::allocator<T>{}.deallocate(memory, size);
            log->emplace_back(event{size * sizeof(T), false});
        }
    }